

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboApiTest.cpp
# Opt level: O3

void deqp::gles2::Functional::textureLevelsTest(TestContext *testCtx,Context *context)

{
  GLenum expect;
  long lVar1;
  
  (*context->_vptr_Context[6])(context,0xde1,1);
  (*context->_vptr_Context[0x7e])(context,0xde1,0,0x1907,0x100,0x100);
  (*context->_vptr_Context[0x7e])(context,0xde1,1,0x1907,0x80,0x80);
  (*context->_vptr_Context[9])(context,0x8d40,1);
  lVar1 = 0;
  do {
    (*context->_vptr_Context[0x1e])
              (context,0x8d40,0x8ce0,0xde1,1,
               (ulong)*(uint *)((long)textureLevelsWithRenderToMipmapTest::levels + lVar1));
    expect = 0x501;
    if (lVar1 == 0x14) {
      expect = 0;
    }
    if (lVar1 == 8) {
      expect = 0;
    }
    checkError(testCtx,context,expect);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x1c);
  return;
}

Assistant:

static void textureLevelsTest (tcu::TestContext& testCtx, sglr::Context& context)
{
	deUint32	tex		= 1;
	deUint32	fbo		= 1;

	context.bindTexture(GL_TEXTURE_2D, tex);
	context.texImage2D(GL_TEXTURE_2D, 0, GL_RGB, 256, 256);
	context.texImage2D(GL_TEXTURE_2D, 1, GL_RGB, 128, 128);

	context.bindFramebuffer(GL_FRAMEBUFFER, fbo);

	static int levels[] = { 2, 1, 0, -1, 0x7fffffff, 0, 1 };

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(levels); ndx++)
	{
		context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex, levels[ndx]);
		checkError(testCtx, context, levels[ndx] == 0 ? GL_NO_ERROR : GL_INVALID_VALUE);
	}
}